

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGeneratorMocUic::ParallelMocAutoRegister
          (string *__return_storage_ptr__,cmQtAutoGeneratorMocUic *this,string *baseName)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  _Self local_98;
  _Self local_90;
  string local_88;
  uint local_64;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  uint ii;
  undefined1 local_58;
  _Self local_50;
  _Self local_48 [3];
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> mocLock;
  string *baseName_local;
  cmQtAutoGeneratorMocUic *this_local;
  string *res;
  
  mocLock._M_device._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->JobsMutex_);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)baseName);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".cpp");
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->MocAutoFiles_,__return_storage_ptr__);
  local_50._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->MocAutoFiles_);
  bVar1 = std::operator==(local_48,&local_50);
  if (bVar1) {
    pVar2 = std::
            set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::emplace<std::__cxx11::string&>
                      ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->MocAutoFiles_,__return_storage_ptr__);
    _Stack_60 = pVar2.first._M_node;
    local_58 = pVar2.second;
  }
  else {
    for (local_64 = 2; local_64 != 0x400; local_64 = local_64 + 1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)baseName);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
      std::__cxx11::to_string(&local_88,local_64);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".cpp");
      local_90._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->MocAutoFiles_,__return_storage_ptr__);
      local_98._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->MocAutoFiles_);
      bVar1 = std::operator==(&local_90,&local_98);
      if (bVar1) {
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::emplace<std::__cxx11::string&>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->MocAutoFiles_,__return_storage_ptr__);
        break;
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorMocUic::ParallelMocAutoRegister(
  std::string const& baseName)
{
  std::string res;
  {
    std::lock_guard<std::mutex> mocLock(JobsMutex_);
    res = baseName;
    res += ".cpp";
    if (MocAutoFiles_.find(res) == MocAutoFiles_.end()) {
      MocAutoFiles_.emplace(res);
    } else {
      // Append number suffix to the file name
      for (unsigned int ii = 2; ii != 1024; ++ii) {
        res = baseName;
        res += '_';
        res += std::to_string(ii);
        res += ".cpp";
        if (MocAutoFiles_.find(res) == MocAutoFiles_.end()) {
          MocAutoFiles_.emplace(res);
          break;
        }
      }
    }
  }
  return res;
}